

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_command * nk__begin(nk_context *ctx)

{
  undefined4 uVar1;
  nk_vec2 nVar2;
  undefined4 uVar3;
  void *pvVar4;
  nk_cursor *img;
  nk_size nVar5;
  void *pvVar6;
  nk_window *pnVar7;
  nk_window *pnVar8;
  nk_size nVar9;
  nk_rect r;
  
  if (ctx == (nk_context *)0x0) {
    return (nk_command *)0x0;
  }
  if (ctx->count != 0) {
    pvVar4 = (ctx->memory).memory.ptr;
    if (ctx->build == 0) {
      if ((ctx->style).cursor_active == (nk_cursor *)0x0) {
        (ctx->style).cursor_active = (ctx->style).cursors[0];
      }
      img = (ctx->style).cursor_active;
      if (((img != (nk_cursor *)0x0) && ((ctx->input).mouse.grabbed == '\0')) &&
         ((ctx->style).cursor_visible != 0)) {
        (ctx->overlay).base = &ctx->memory;
        (ctx->overlay).use_clipping = 0;
        nVar5 = (ctx->memory).allocated;
        (ctx->overlay).begin = nVar5;
        (ctx->overlay).end = nVar5;
        (ctx->overlay).last = nVar5;
        (ctx->overlay).clip = nk_null_rect;
        nVar2 = (ctx->input).mouse.pos;
        uVar1 = (img->size).x;
        uVar3 = (img->size).y;
        r.h = (float)uVar3;
        r.w = (float)uVar1;
        r.x = nVar2.x - (img->offset).x;
        r.y = nVar2.y - (img->offset).y;
        nk_draw_image(&ctx->overlay,r,&img->img,(nk_color)0xffffffff);
        (ctx->overlay).end = (ctx->memory).allocated;
      }
      if (ctx->begin != (nk_window *)0x0) {
        pvVar6 = (ctx->memory).memory.ptr;
        pnVar8 = ctx->begin;
        do {
          nVar5 = (pnVar8->buffer).last;
          pnVar7 = pnVar8->next;
          if ((nVar5 != (pnVar8->buffer).begin) && ((pnVar8->flags & 0x1000) == 0)) {
            for (; pnVar7 != (nk_window *)0x0; pnVar7 = pnVar7->next) {
              nVar9 = (pnVar7->buffer).begin;
              if (((pnVar7->buffer).last != nVar9) && ((pnVar7->flags & 0x1000) == 0))
              goto LAB_0010ebc3;
            }
            nVar9 = (ctx->overlay).begin;
            if ((ctx->overlay).end == nVar9) {
              nVar9 = (ctx->memory).allocated;
            }
LAB_0010ebc3:
            *(nk_size *)((long)pvVar6 + nVar5 + 8) = nVar9;
          }
          pnVar8 = pnVar7;
        } while (pnVar7 != (nk_window *)0x0);
      }
      ctx->build = 1;
    }
    pnVar8 = ctx->begin;
    if (pnVar8 != (nk_window *)0x0) {
      while ((nVar5 = (pnVar8->buffer).begin, nVar5 == (pnVar8->buffer).end ||
             ((pnVar8->flags & 0x1000) != 0))) {
        pnVar8 = pnVar8->next;
        if (pnVar8 == (nk_window *)0x0) {
          return (nk_command *)0x0;
        }
      }
      return (nk_command *)((long)pvVar4 + nVar5);
    }
  }
  return (nk_command *)0x0;
}

Assistant:

NK_API const struct nk_command*
nk__begin(struct nk_context *ctx)
{
    struct nk_window *iter;
    nk_byte *buffer;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    if (!ctx->count) return 0;

    buffer = (nk_byte*)ctx->memory.memory.ptr;
    if (!ctx->build) {
        nk_build(ctx);
        ctx->build = nk_true;
    }

    iter = ctx->begin;
    while (iter && ((iter->buffer.begin == iter->buffer.end) || (iter->flags & NK_WINDOW_HIDDEN)))
        iter = iter->next;
    if (!iter) return 0;
    return nk_ptr_add_const(struct nk_command, buffer, iter->buffer.begin);
}